

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O2

void * Js::JavascriptNativeOperators::Op_SwitchStringLookUp
                 (JavascriptString *str,
                 BranchDictionaryWrapper<Js::JavascriptString_*> *branchTargets,uintptr_t funcStart,
                 uintptr_t funcEnd)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  JavascriptString *local_30;
  JavascriptString *str_local;
  void *defaultTarget;
  
  str_local = *(JavascriptString **)(branchTargets + 0x38);
  local_30 = str;
  ppvVar4 = JsUtil::
            BaseDictionary<Js::JavascriptString*,void*,Js::BranchDictionaryWrapper<Js::JavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<Js::JavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
            ::LookupWithKey<Js::JavascriptString*>
                      ((BaseDictionary<Js::JavascriptString*,void*,Js::BranchDictionaryWrapper<Js::JavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<Js::JavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
                        *)branchTargets,&local_30,&str_local);
  pvVar1 = *ppvVar4;
  if (funcEnd - funcStart < (long)pvVar1 - funcStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JavascriptNativeOperators.cpp"
                                ,0x12,"((utarget - funcStart) <= (funcEnd - funcStart))",
                                "Switch string dictionary jump target outside of function");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return pvVar1;
}

Assistant:

void * JavascriptNativeOperators::Op_SwitchStringLookUp(JavascriptString* str, Js::BranchDictionaryWrapper<JavascriptString*>* branchTargets, uintptr_t funcStart, uintptr_t funcEnd)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_SwitchStringLookUp);
        void* defaultTarget = branchTargets->defaultTarget;
        Js::BranchDictionaryWrapper<JavascriptString*>::BranchDictionary& stringDictionary = branchTargets->dictionary;
        void* target = stringDictionary.Lookup(str, defaultTarget);
        uintptr_t utarget = (uintptr_t)target;

        AssertOrFailFastMsg((utarget - funcStart) <= (funcEnd - funcStart), "Switch string dictionary jump target outside of function");
        return target;
        JIT_HELPER_END(Op_SwitchStringLookUp);
    }